

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ParenthesizedConditionalDirectiveExpressionSyntax *pPVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  not_null<slang::syntax::ConditionalDirectiveExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ConditionalDirectiveExpressionSyntax_*> *)0x7bc433);
  deepClone<slang::syntax::ConditionalDirectiveExpressionSyntax>
            ((ConditionalDirectiveExpressionSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  TVar3 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ParenthesizedConditionalDirectiveExpressionSyntax,slang::parsing::Token,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::parsing::Token>
                     (this,(Token *)TVar2.info,TVar2._0_8_,(Token *)TVar3.info);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ParenthesizedConditionalDirectiveExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ParenthesizedConditionalDirectiveExpressionSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone<ConditionalDirectiveExpressionSyntax>(*node.operand, alloc),
        node.closeParen.deepClone(alloc)
    );
}